

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void move_tokens(VARR_token_t *to,VARR_token_t *from)

{
  token_t ptVar1;
  pre_ctx *ppVar2;
  VARR_char_ptr_t *pVVar3;
  size_t sVar4;
  char_ptr_t *ppcVar5;
  stream_t psVar6;
  VARR_ifstate_t *pVVar7;
  int iVar8;
  c2m_ctx_t __ptr;
  FILE *f;
  token_t *in_RCX;
  VARR_token_t *__s1;
  VARR_token_t *pVVar9;
  char *extraout_RDX;
  size_t sVar10;
  VARR_token_t *pVVar11;
  c2m_ctx_t c2m_ctx;
  undefined8 in_R8;
  undefined1 *puVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((to == (VARR_token_t *)0x0) || (to->varr == (token_t *)0x0)) {
LAB_00192b6d:
    move_tokens_cold_5();
    __s1 = from;
    c2m_ctx = (c2m_ctx_t)to;
LAB_00192b72:
    move_tokens_cold_4();
  }
  else {
    to->els_num = 0;
    __s1 = from;
    c2m_ctx = (c2m_ctx_t)to;
    if (from == (VARR_token_t *)0x0) goto LAB_00192b72;
    in_RCX = from->varr;
    bVar14 = in_RCX == (token_t *)0x0;
    if (from->els_num != 0) {
      uVar13 = 0;
      __s1 = (VARR_token_t *)0x0;
      pVVar11 = from;
      do {
        if (bVar14) {
          move_tokens_cold_2();
LAB_00192b68:
          to = (VARR_token_t *)c2m_ctx;
          from = pVVar11;
          move_tokens_cold_1();
          goto LAB_00192b6d;
        }
        __ptr = (c2m_ctx_t)to->varr;
        if (__ptr == (c2m_ctx_t)0x0) goto LAB_00192b68;
        ptVar1 = in_RCX[uVar13];
        pVVar11 = (VARR_token_t *)((long)&__s1->els_num + 1);
        pVVar9 = __s1;
        __s1 = pVVar11;
        if ((VARR_token_t *)to->size < pVVar11) {
          puVar12 = (undefined1 *)((long)&pVVar11->els_num + ((ulong)pVVar11 >> 1));
          c2m_ctx = __ptr;
          __ptr = (c2m_ctx_t)realloc(__ptr,(long)puVar12 * 8);
          to->varr = (token_t *)__ptr;
          to->size = (size_t)puVar12;
          pVVar9 = (VARR_token_t *)to->els_num;
          __s1 = (VARR_token_t *)((long)&pVVar9->els_num + 1);
        }
        to->els_num = (size_t)__s1;
        __ptr->env[0].__jmpbuf[(long)((long)&pVVar9[-1].varr + 6)] = (long)ptVar1;
        uVar13 = uVar13 + 1;
        in_RCX = from->varr;
        bVar14 = in_RCX == (token_t *)0x0;
        pVVar11 = __s1;
      } while (uVar13 < from->els_num);
    }
    if (!bVar14) {
      from->els_num = 0;
      return;
    }
  }
  move_tokens_cold_3();
  ppVar2 = c2m_ctx->pre_ctx;
  pVVar3 = ppVar2->once_include_files;
  if (pVVar3 == (VARR_char_ptr_t *)0x0) {
LAB_00192c68:
    add_include_stream_cold_3();
LAB_00192c6d:
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x89b,"void add_include_stream(c2m_ctx_t, const char *, const char *, pos_t)");
  }
  sVar4 = pVVar3->els_num;
  if (sVar4 != 0) {
    ppcVar5 = pVVar3->varr;
    sVar10 = 0;
    do {
      if (ppcVar5 == (char_ptr_t *)0x0) {
        add_include_stream_cold_1();
        goto LAB_00192c68;
      }
      iVar8 = strcmp((char *)__s1,ppcVar5[sVar10]);
      if (iVar8 == 0) {
        return;
      }
      sVar10 = sVar10 + 1;
    } while (sVar4 != sVar10);
  }
  if (__s1 == (VARR_token_t *)0x0) goto LAB_00192c6d;
  if (extraout_RDX == (char *)0x0) {
    f = fopen((char *)__s1,"rb");
    if (f == (FILE *)0x0) goto LAB_00192c91;
    add_stream(c2m_ctx,(FILE *)f,(char *)__s1,(_func_int_c2m_ctx_t *)0x0);
  }
  else {
    add_stream(c2m_ctx,(FILE *)0x0,(char *)__s1,str_getc);
    psVar6 = c2m_ctx->cs;
    psVar6->curr = extraout_RDX;
    psVar6->start = extraout_RDX;
  }
  pVVar7 = ppVar2->ifs;
  if (pVVar7 != (VARR_ifstate_t *)0x0) {
    c2m_ctx->cs->ifs_length_at_stream_start = (int)pVVar7->els_num;
    return;
  }
  add_include_stream_cold_2();
LAB_00192c91:
  if (c2m_ctx->options->message_file != (FILE *)0x0) {
    error(c2m_ctx,0x1c18b5,(char *)in_RCX,in_R8,__s1);
  }
  longjmp((__jmp_buf_tag *)c2m_ctx->env,1);
}

Assistant:

static void move_tokens (VARR (token_t) * to, VARR (token_t) * from) {
  VARR_TRUNC (token_t, to, 0);
  for (size_t i = 0; i < VARR_LENGTH (token_t, from); i++)
    VARR_PUSH (token_t, to, VARR_GET (token_t, from, i));
  VARR_TRUNC (token_t, from, 0);
}